

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_string_class.cpp
# Opt level: O0

void string_files(void)

{
  byte bVar1;
  bool bVar2;
  ostream *poVar3;
  int local_244;
  string local_240 [4];
  int count;
  string item;
  long local_210;
  ifstream file_input;
  
  std::ifstream::ifstream(&local_210);
  std::ifstream::open((char *)&local_210,0x145ad7);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    std::operator<<((ostream *)&std::cerr,"Cannot open file...\n");
    exit(1);
  }
  std::operator<<((ostream *)&std::cout,"open file successfully...\n");
  std::__cxx11::string::string(local_240);
  local_244 = 0;
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&local_210,local_240,':');
  while( true ) {
    bVar2 = std::ios::operator_cast_to_bool
                      ((ios *)((long)&local_210 + *(long *)(local_210 + -0x18)));
    if (!bVar2) break;
    local_244 = local_244 + 1;
    poVar3 = (ostream *)std::ostream::operator<<(&std::cout,local_244);
    poVar3 = std::operator<<(poVar3,": ");
    poVar3 = std::operator<<(poVar3,local_240);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&local_210,local_240,':');
  }
  std::operator<<((ostream *)&std::cout,"Done!\n");
  std::ifstream::close();
  std::__cxx11::string::~string(local_240);
  std::ifstream::~ifstream(&local_210);
  return;
}

Assistant:

void string_files() {
    using namespace std;

    //  input file stream instance
    ifstream file_input;
    file_input.open("tobuy.txt");

    if (file_input.is_open() == false) {
        //  similar to "console.error" ?
        cerr << "Cannot open file...\n";
        exit(EXIT_FAILURE); // process.exit(x)
    } else {
        //  must create the file manually...
        cout << "open file successfully...\n";
    }

    string item;
    int count = 0;
    getline(file_input, item, ':');
    while(file_input) {
        ++count; // line count, split by ':' (by default it is '\n')
        cout << count << ": " << item << endl;
        //  can this turned to "do {} while" ?
        getline(file_input, item, ':');
    }

    cout << "Done!\n";
    file_input.close();
}